

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O0

int __thiscall
glcts::TessellationShaderPointsTests::init(TessellationShaderPointsTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TessellationShaderPointsgl_PointSize *this_00;
  TessellationShaderPointsVerification *this_01;
  TessellationShaderPointsTests *this_local;
  
  this_00 = (TessellationShaderPointsgl_PointSize *)operator_new(0x2d8);
  TessellationShaderPointsgl_PointSize::TessellationShaderPointsgl_PointSize
            (this_00,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TessellationShaderPointsVerification *)operator_new(0x2d8);
  TessellationShaderPointsVerification::TessellationShaderPointsVerification
            (this_01,(this->super_TestCaseGroupBase).m_context,
             &(this->super_TestCaseGroupBase).m_extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void TessellationShaderPointsTests::init(void)
{
	addChild(new glcts::TessellationShaderPointsgl_PointSize(m_context, m_extParams));
	addChild(new glcts::TessellationShaderPointsVerification(m_context, m_extParams));
}